

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall
lzham::symbol_codec::encode(symbol_codec *this,uint bit,adaptive_bit_model *model,bool update_model)

{
  bool bVar1;
  uint uVar2;
  byte in_CL;
  ushort *in_RDX;
  int in_ESI;
  symbol_codec *in_RDI;
  uint orig_base;
  uint x;
  output_symbol sym;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  bool local_1;
  
  in_RDI->m_arith_total_bits = in_RDI->m_arith_total_bits + 1;
  bVar1 = vector<lzham::symbol_codec::output_symbol>::try_push_back
                    ((vector<lzham::symbol_codec::output_symbol> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (output_symbol *)in_RDI);
  if (bVar1) {
    uVar2 = (uint)*in_RDX * (in_RDI->m_arith_length >> 0xb);
    if (in_ESI == 0) {
      if ((in_CL & 1) != 0) {
        *in_RDX = *in_RDX + (short)(0x800 - *in_RDX >> 5);
      }
      in_RDI->m_arith_length = uVar2;
    }
    else {
      if ((in_CL & 1) != 0) {
        *in_RDX = *in_RDX - (short)((int)(uint)*in_RDX >> 5);
      }
      in_stack_ffffffffffffffcc = in_RDI->m_arith_base;
      in_RDI->m_arith_base = uVar2 + in_RDI->m_arith_base;
      in_RDI->m_arith_length = in_RDI->m_arith_length - uVar2;
      if (in_RDI->m_arith_base < in_stack_ffffffffffffffcc) {
        arith_propagate_carry(in_RDI);
      }
    }
    if ((0xffffff < in_RDI->m_arith_length) ||
       (bVar1 = arith_renorm_enc_interval
                          ((symbol_codec *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)), bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool symbol_codec::encode(uint bit, adaptive_bit_model& model, bool update_model)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      m_arith_total_bits++;

      output_symbol sym;
      sym.m_bits = bit;
      sym.m_num_bits = -1;
      sym.m_arith_prob0 = model.m_bit_0_prob;
      if (!m_output_syms.try_push_back(sym))
         return false;

      uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);

      if (!bit)
      {
         if (update_model)
            model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);

         m_arith_length = x;
      }
      else
      {
         if (update_model)
            model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);

         uint orig_base = m_arith_base;
         m_arith_base   += x;
         m_arith_length -= x;
         if (orig_base > m_arith_base)
            arith_propagate_carry();
      }

      if (m_arith_length < cSymbolCodecArithMinLen)
      {
         if (!arith_renorm_enc_interval())
            return false;
      }

      return true;
   }